

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_version_negotiation.c
# Opt level: O0

int main(int argc,char **argv)

{
  pcp_fstate_e pVar1;
  pcp_ctx_t *ctx_00;
  sockaddr *pcp_server;
  uint local_1d4;
  pcp_ctx_t *ctx;
  size_t flow_count;
  pcp_flow_info_t *flow_info;
  pcp_flow_t *flow;
  uint32_t lifetime;
  uint8_t protocol;
  pcp_server_t *s;
  undefined1 local_198 [4];
  int version;
  sockaddr_storage ext;
  sockaddr_storage source;
  sockaddr_storage destination;
  char **argv_local;
  int argc_local;
  
  flow._7_1_ = '\x06';
  flow._0_4_ = 10;
  flow_info = (pcp_flow_info_t *)0x0;
  flow_count = 0;
  if (argc == 2) {
    local_1d4 = atoi(argv[1]);
    local_1d4 = local_1d4 & 0xff;
  }
  else {
    local_1d4 = 2;
  }
  s._4_4_ = local_1d4;
  pcp_log_level = PCP_LOGLVL_NONE;
  if (argc == 2) {
    printf("\n");
    fprintf(_stdout,"###########################################\n");
    printf("####   *****************************   ####\n");
    printf("####   * Begin version negotiation *   ####\n");
    printf("####   *           test            *   ####\n");
    printf("####   *****************************   ####\n");
    printf("###########################################\n");
    printf(">>> PCP server version =  %d \n",(ulong)s._4_4_);
    ctx_00 = pcp_init('\0',(pcp_socket_vt_t *)0x0);
    pcp_server = Sock_pton("127.0.0.1:5351");
    pcp_add_server(ctx_00,pcp_server,(uint8_t)s._4_4_);
    sock_pton("127.0.0.1:1234",(sockaddr *)&source.__ss_align);
    sock_pton("127.0.0.1:1235",(sockaddr *)&ext.__ss_align);
    sock_pton("10.20.30.40",(sockaddr *)local_198);
    flow_info = (pcp_flow_info_t *)
                pcp_new_flow(ctx_00,(sockaddr *)&ext.__ss_align,(sockaddr *)&source.__ss_align,
                             (sockaddr *)local_198,flow._7_1_,(uint32_t)flow,(void *)0x0);
    pVar1 = pcp_wait((pcp_flow_t *)flow_info,2000,0);
    if (pVar1 != pcp_state_succeeded) {
      printf("%s:%d Test \'%s\' failed!\n",
             "/workspace/llm4binary/github/license_c_cmakelists/libpcp[P]pcp/tests/test_version_negotiation.c"
             ,0x4f,"pcp_wait(flow, 2000, 0) == pcp_state_succeeded");
      exit(1);
    }
    flow_count = (size_t)pcp_flow_get_info((pcp_flow_t *)flow_info,(size_t *)&ctx);
    if ((pcp_flow_info_t *)flow_count == (pcp_flow_info_t *)0x0) {
      printf("%s:%d Test \'%s\' failed!\n",
             "/workspace/llm4binary/github/license_c_cmakelists/libpcp[P]pcp/tests/test_version_negotiation.c"
             ,0x51,"flow_info");
      exit(1);
    }
    printf("Flow result code %d \n",(ulong)((pcp_flow_info_t *)flow_count)->pcp_result_code);
    _lifetime = get_pcp_server(ctx_00,*(int *)&flow_info[1].pcp_result_code);
    if ((_lifetime == (pcp_server_t *)0x0) || (_lifetime->pcp_version != '\x01')) {
      printf("%s:%d Test \'%s\' failed!\n",
             "/workspace/llm4binary/github/license_c_cmakelists/libpcp[P]pcp/tests/test_version_negotiation.c"
             ,0x54,"(s) && (s->pcp_version == 1)");
      exit(1);
    }
    pcp_close_flow((pcp_flow_t *)flow_info);
    pcp_delete_flow((pcp_flow_t *)flow_info);
    flow_info = (pcp_flow_info_t *)0x0;
    free((void *)flow_count);
    pcp_terminate(ctx_00,0);
    argv_local._4_4_ = 0;
  }
  else {
    printf("Invalid number of arguments.\n");
    printf("This test takes only one argument, PCP version number.\n");
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
    struct sockaddr_storage destination;
    struct sockaddr_storage source;
    struct sockaddr_storage ext;
    int version;
    pcp_server_t *s;
    uint8_t protocol = 6;
    uint32_t lifetime = 10;
    pcp_flow_t *flow = NULL;
    pcp_flow_info_t *flow_info = NULL;
    size_t flow_count;
    pcp_ctx_t *ctx;

    PD_SOCKET_STARTUP();
    version = (argc == 2) ? (uint8_t)atoi(argv[1]) : PCP_MAX_SUPPORTED_VERSION;

    pcp_log_level = 0;

    if (argc != 2) { // LCOV_EXCL_START
        printf("Invalid number of arguments.\n");
        printf("This test takes only one argument, PCP version number.\n");
        return -1;
    } // LCOV_EXCL_STOP

    printf("\n");
    fprintf(stdout, "###########################################\n");
    printf("####   *****************************   ####\n");
    printf("####   * Begin version negotiation *   ####\n");
    printf("####   *           test            *   ####\n");
    printf("####   *****************************   ####\n");
    printf("###########################################\n");
    printf(">>> PCP server version =  %d \n", version);
    ctx = pcp_init(0, NULL);
    pcp_add_server(ctx, Sock_pton("127.0.0.1:5351"), version);

    sock_pton("127.0.0.1:1234", (struct sockaddr *)&destination);
    sock_pton("127.0.0.1:1235", (struct sockaddr *)&source);
    sock_pton("10.20.30.40", (struct sockaddr *)&ext);

    flow = pcp_new_flow(ctx, (struct sockaddr *)&source,
                        (struct sockaddr *)&destination,
                        (struct sockaddr *)&ext, protocol, lifetime, NULL);

    TEST(pcp_wait(flow, 2000, 0) == pcp_state_succeeded);
    flow_info = pcp_flow_get_info(flow, &flow_count);
    TEST(flow_info);
    printf("Flow result code %d \n", flow_info->pcp_result_code);
    s = get_pcp_server(ctx, flow->pcp_server_indx);
    TEST((s) && (s->pcp_version == 1));

    pcp_close_flow(flow);
    pcp_delete_flow(flow);
    flow = NULL;
    free(flow_info);

    PD_SOCKET_CLEANUP();
    pcp_terminate(ctx, 0);
    return 0;
}